

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>
fmt::v8::detail::
write_significand<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char_const*,fmt::v8::detail::digit_grouping<char16_t>>
          (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out,char *significand,
          int significand_size,int exponent,digit_grouping<char16_t> *grouping)

{
  basic_string_view<char> digits;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> bVar1;
  memory_buffer buffer;
  char local_239;
  buffer<char> local_238;
  char local_218 [504];
  
  if ((grouping->sep_).thousands_sep == L'\0') {
    bVar1 = copy_str<char16_t,char_const*,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                      (significand,significand + significand_size,out);
    local_238._vptr_buffer = (_func_int **)CONCAT62(local_238._vptr_buffer._2_6_,0x30);
    bVar1 = fill_n<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,int,char16_t>
                      (bVar1,exponent,(char16_t *)&local_238);
  }
  else {
    local_238.size_ = 0;
    local_238._vptr_buffer = (_func_int **)&PTR_grow_001b3930;
    local_238.capacity_ = 500;
    local_238.ptr_ = local_218;
    buffer<char>::append<char>(&local_238,significand,significand + significand_size);
    local_239 = '0';
    fill_n<fmt::v8::appender,int,char>((appender)&local_238,exponent,&local_239);
    digits.size_ = local_238.size_;
    digits.data_ = local_238.ptr_;
    bVar1 = digit_grouping<char16_t>::
            apply<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char>
                      (grouping,out,digits);
    if (local_238.ptr_ != local_218) {
      operator_delete(local_238.ptr_,local_238.capacity_);
    }
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar1.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int exponent,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.separator()) {
    out = write_significand<Char>(out, significand, significand_size);
    return detail::fill_n(out, exponent, static_cast<Char>('0'));
  }
  auto buffer = memory_buffer();
  write_significand<char>(appender(buffer), significand, significand_size);
  detail::fill_n(appender(buffer), exponent, '0');
  return grouping.apply(out, string_view(buffer.data(), buffer.size()));
}